

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba_test.cpp
# Opt level: O0

void __thiscall JiebaTest_WordTest_Test::TestBody(JiebaTest_WordTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  string result;
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> words;
  Jieba jieba;
  string *in_stack_fffffffffffff538;
  undefined1 hmm;
  undefined7 in_stack_fffffffffffff540;
  undefined1 in_stack_fffffffffffff547;
  string *in_stack_fffffffffffff548;
  string *sentence;
  Jieba *in_stack_fffffffffffff550;
  undefined4 in_stack_fffffffffffff558;
  int in_stack_fffffffffffff55c;
  int line;
  char *in_stack_fffffffffffff560;
  allocator<char> *file;
  undefined8 in_stack_fffffffffffff568;
  Type type;
  undefined7 in_stack_fffffffffffff570;
  undefined1 in_stack_fffffffffffff577;
  undefined1 uVar3;
  char *in_stack_fffffffffffff578;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff580;
  undefined7 in_stack_fffffffffffff588;
  undefined1 in_stack_fffffffffffff58f;
  string *in_stack_fffffffffffff590;
  string *in_stack_fffffffffffff598;
  undefined7 in_stack_fffffffffffff5a0;
  undefined1 in_stack_fffffffffffff5a7;
  undefined1 uVar4;
  string *in_stack_fffffffffffff5a8;
  Jieba *in_stack_fffffffffffff5b0;
  AssertionResult local_9e0;
  undefined1 local_9c9 [49];
  AssertionResult local_998;
  allocator<char> local_981;
  string local_980 [48];
  AssertionResult local_950;
  allocator<char> local_939;
  string local_938 [48];
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *in_stack_fffffffffffff6f8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff700;
  allocator<char> local_8f1;
  string local_8f0 [48];
  AssertionResult local_8c0;
  allocator<char> local_8a9;
  string local_8a8 [48];
  AssertionResult local_878;
  allocator<char> local_861;
  string local_860 [36];
  uint local_83c;
  AssertionResult local_828;
  allocator<char> local_811;
  string local_810 [32];
  string local_7f0 [63];
  allocator<char> local_7b1;
  string local_7b0 [39];
  allocator<char> local_789;
  string local_788 [39];
  allocator<char> local_761;
  string local_760 [39];
  allocator<char> local_739;
  string local_738 [55];
  allocator<char> local_701;
  string local_700 [1792];
  
  type = (Type)((ulong)in_stack_fffffffffffff568 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570));
  cppjieba::Jieba::Jieba
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,
             (string *)CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),
             in_stack_fffffffffffff598,in_stack_fffffffffffff590,
             (string *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588));
  std::__cxx11::string::~string(local_7b0);
  std::allocator<char>::~allocator(&local_7b1);
  std::__cxx11::string::~string(local_788);
  std::allocator<char>::~allocator(&local_789);
  std::__cxx11::string::~string(local_760);
  std::allocator<char>::~allocator(&local_761);
  std::__cxx11::string::~string(local_738);
  std::allocator<char>::~allocator(&local_739);
  std::__cxx11::string::~string(local_700);
  std::allocator<char>::~allocator(&local_701);
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::vector
            ((vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)0x1d3b44);
  std::__cxx11::string::string(local_7f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570));
  cppjieba::Jieba::Cut
            (in_stack_fffffffffffff550,in_stack_fffffffffffff548,
             (vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)
             CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540),
             SUB81((ulong)in_stack_fffffffffffff538 >> 0x38,0));
  std::__cxx11::string::~string(local_810);
  std::allocator<char>::~allocator(&local_811);
  std::operator<<(in_stack_fffffffffffff700.ptr_,in_stack_fffffffffffff6f8);
  testing::internal::EqHelper<false>::Compare<char[196],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),
             (char *)in_stack_fffffffffffff550,(char (*) [196])in_stack_fffffffffffff548,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_828);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570));
    testing::AssertionResult::failure_message((AssertionResult *)0x1d3dd9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),type,
               in_stack_fffffffffffff560,in_stack_fffffffffffff55c,(char *)in_stack_fffffffffffff550
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),
               (Message *)in_stack_fffffffffffff598);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540));
    testing::Message::~Message((Message *)0x1d3e3c);
  }
  local_83c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d3eaa);
  if (local_83c == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff580,in_stack_fffffffffffff578,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570));
    cppjieba::Jieba::Cut
              (in_stack_fffffffffffff550,in_stack_fffffffffffff548,
               (vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)
               CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540),
               SUB81((ulong)in_stack_fffffffffffff538 >> 0x38,0));
    std::__cxx11::string::~string(local_860);
    std::allocator<char>::~allocator(&local_861);
    std::operator<<(in_stack_fffffffffffff700.ptr_,in_stack_fffffffffffff6f8);
    testing::internal::EqHelper<false>::Compare<char[140],std::__cxx11::string>
              ((char *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),
               (char *)in_stack_fffffffffffff550,(char (*) [140])in_stack_fffffffffffff548,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_878);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570));
      testing::AssertionResult::failure_message((AssertionResult *)0x1d4024);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),type,
                 in_stack_fffffffffffff560,in_stack_fffffffffffff55c,
                 (char *)in_stack_fffffffffffff550);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),
                 (Message *)in_stack_fffffffffffff598);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540));
      testing::Message::~Message((Message *)0x1d4087);
    }
    local_83c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d40f5);
    if (local_83c == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff580,in_stack_fffffffffffff578,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570));
      cppjieba::Jieba::CutSmall
                (in_stack_fffffffffffff550,in_stack_fffffffffffff548,
                 (vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)
                 CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540),
                 (size_t)in_stack_fffffffffffff538);
      std::__cxx11::string::~string(local_8a8);
      std::allocator<char>::~allocator(&local_8a9);
      std::operator<<(in_stack_fffffffffffff700.ptr_,in_stack_fffffffffffff6f8);
      testing::internal::EqHelper<false>::Compare<char[104],std::__cxx11::string>
                ((char *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),
                 (char *)in_stack_fffffffffffff550,(char (*) [104])in_stack_fffffffffffff548,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8c0);
      uVar4 = bVar1;
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570));
        in_stack_fffffffffffff598 =
             (string *)testing::AssertionResult::failure_message((AssertionResult *)0x1d4268);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                   type,in_stack_fffffffffffff560,in_stack_fffffffffffff55c,
                   (char *)in_stack_fffffffffffff550);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffff5a0),
                   (Message *)in_stack_fffffffffffff598);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540));
        testing::Message::~Message((Message *)0x1d42c5);
      }
      local_83c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d4333);
      if (local_83c == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff580,in_stack_fffffffffffff578,
                   (allocator<char> *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570))
        ;
        cppjieba::Jieba::CutHMM
                  ((Jieba *)CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540),
                   in_stack_fffffffffffff538,
                   (vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)0x1d438e);
        std::__cxx11::string::~string(local_8f0);
        std::allocator<char>::~allocator(&local_8f1);
        std::operator<<(in_stack_fffffffffffff700.ptr_,in_stack_fffffffffffff6f8);
        testing::internal::EqHelper<false>::Compare<char[271],std::__cxx11::string>
                  ((char *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),
                   (char *)in_stack_fffffffffffff550,(char (*) [271])in_stack_fffffffffffff548,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540));
        bVar1 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xfffffffffffff6f8);
        if (!bVar1) {
          testing::Message::Message
                    ((Message *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570));
          in_stack_fffffffffffff580 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               testing::AssertionResult::failure_message((AssertionResult *)0x1d449f);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                     type,in_stack_fffffffffffff560,in_stack_fffffffffffff55c,
                     (char *)in_stack_fffffffffffff550);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffff5a0),
                     (Message *)in_stack_fffffffffffff598);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540));
          testing::Message::~Message((Message *)0x1d44fc);
        }
        local_83c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d456a);
        if (local_83c == 0) {
          __s = &local_939;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff580,(char *)__s,
                     (allocator<char> *)
                     CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570));
          cppjieba::Jieba::Cut
                    (in_stack_fffffffffffff550,in_stack_fffffffffffff548,
                     (vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)
                     CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540),
                     SUB81((ulong)in_stack_fffffffffffff538 >> 0x38,0));
          std::__cxx11::string::~string(local_938);
          std::allocator<char>::~allocator(&local_939);
          std::operator<<(in_stack_fffffffffffff700.ptr_,in_stack_fffffffffffff6f8);
          testing::internal::EqHelper<false>::Compare<char[364],std::__cxx11::string>
                    ((char *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),
                     (char *)in_stack_fffffffffffff550,(char (*) [364])in_stack_fffffffffffff548,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540));
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_950);
          uVar3 = bVar1;
          if (!bVar1) {
            testing::Message::Message((Message *)CONCAT17(bVar1,in_stack_fffffffffffff570));
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1d46db);
            type = (Type)((ulong)pcVar2 >> 0x20);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffff570),type,
                       in_stack_fffffffffffff560,in_stack_fffffffffffff55c,
                       (char *)in_stack_fffffffffffff550);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffff5a0),
                       (Message *)in_stack_fffffffffffff598);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540)
                      );
            testing::Message::~Message((Message *)0x1d4738);
          }
          local_83c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d47a6);
          if (local_83c == 0) {
            file = &local_981;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff580,(char *)__s,
                       (allocator<char> *)CONCAT17(uVar3,in_stack_fffffffffffff570));
            cppjieba::Jieba::CutAll
                      ((Jieba *)CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540),
                       in_stack_fffffffffffff538,
                       (vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)0x1d4801);
            hmm = (undefined1)((ulong)in_stack_fffffffffffff538 >> 0x38);
            std::__cxx11::string::~string(local_980);
            std::allocator<char>::~allocator(&local_981);
            std::operator<<(in_stack_fffffffffffff700.ptr_,in_stack_fffffffffffff6f8);
            testing::internal::EqHelper<false>::Compare<char[323],std::__cxx11::string>
                      ((char *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),
                       (char *)in_stack_fffffffffffff550,(char (*) [323])in_stack_fffffffffffff548,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540));
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_998);
            line = CONCAT13(bVar1,(int3)in_stack_fffffffffffff55c);
            if (!bVar1) {
              testing::Message::Message((Message *)CONCAT17(uVar3,in_stack_fffffffffffff570));
              in_stack_fffffffffffff550 =
                   (Jieba *)testing::AssertionResult::failure_message((AssertionResult *)0x1d4912);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffff570),type,(char *)file
                         ,line,(char *)in_stack_fffffffffffff550);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffff5a0),
                         (Message *)in_stack_fffffffffffff598);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)
                         CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540));
              testing::Message::~Message((Message *)0x1d496f);
            }
            local_83c = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d49dd);
            if (local_83c == 0) {
              sentence = (string *)local_9c9;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffff580,(char *)__s,
                         (allocator<char> *)CONCAT17(uVar3,in_stack_fffffffffffff570));
              cppjieba::Jieba::CutForSearch
                        (in_stack_fffffffffffff550,sentence,
                         (vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)
                         CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540),(bool)hmm);
              std::__cxx11::string::~string((string *)(local_9c9 + 1));
              std::allocator<char>::~allocator((allocator<char> *)local_9c9);
              std::operator<<(in_stack_fffffffffffff700.ptr_,in_stack_fffffffffffff6f8);
              testing::internal::EqHelper<false>::Compare<char[196],std::__cxx11::string>
                        ((char *)CONCAT44(line,in_stack_fffffffffffff558),
                         (char *)in_stack_fffffffffffff550,(char (*) [196])sentence,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540));
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_9e0);
              in_stack_fffffffffffff547 = bVar1;
              if (!bVar1) {
                testing::Message::Message((Message *)CONCAT17(uVar3,in_stack_fffffffffffff570));
                testing::AssertionResult::failure_message((AssertionResult *)0x1d4b4e);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffff570),type,
                           (char *)file,line,(char *)in_stack_fffffffffffff550);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffff5a0),
                           (Message *)in_stack_fffffffffffff598);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)
                           CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540));
                testing::Message::~Message((Message *)0x1d4ba9);
              }
              local_83c = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d4c14);
              if (local_83c == 0) {
                local_83c = 0;
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string(local_7f0);
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::~vector
            ((vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)in_stack_fffffffffffff550);
  cppjieba::Jieba::~Jieba((Jieba *)CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540));
  return;
}

Assistant:

TEST(JiebaTest, WordTest) {
  cppjieba::Jieba jieba("../dict/jieba.dict.utf8",
                        "../dict/hmm_model.utf8",
                        "../dict/user.dict.utf8",
                        "../dict/idf.utf8",
                        "../dict/stop_words.utf8");
  vector<Word> words;
  string result;

  jieba.Cut("他来到了网易杭研大厦", words);
  result << words;
  ASSERT_EQ("[{\"word\": \"\xE4\xBB\x96\", \"offset\": 0}, {\"word\": \"\xE6\x9D\xA5\xE5\x88\xB0\", \"offset\": 3}, {\"word\": \"\xE4\xBA\x86\", \"offset\": 9}, {\"word\": \"\xE7\xBD\x91\xE6\x98\x93\", \"offset\": 12}, {\"word\": \"\xE6\x9D\xAD\xE7\xA0\x94\", \"offset\": 18}, {\"word\": \"\xE5\xA4\xA7\xE5\x8E\xA6\", \"offset\": 24}]", result);

  jieba.Cut("我来自北京邮电大学。", words, false);
  result << words;
  //ASSERT_EQ("[\"我\", \"来自\", \"北京邮电大学\", \"。\"]", result);
  ASSERT_EQ("[{\"word\": \"\xE6\x88\x91\", \"offset\": 0}, {\"word\": \"\xE6\x9D\xA5\xE8\x87\xAA\", \"offset\": 3}, {\"word\": \"\xE5\x8C\x97\xE4\xBA\xAC\xE9\x82\xAE\xE7\x94\xB5\xE5\xA4\xA7\xE5\xAD\xA6\", \"offset\": 9}, {\"word\": \"\xE3\x80\x82\", \"offset\": 27}]", result);

  jieba.CutSmall("南京市长江大桥", words, 3);
  //ASSERT_EQ("[\"南京市\", \"长江\", \"大桥\"]", result << words);
  ASSERT_EQ("[{\"word\": \"\xE5\x8D\x97\xE4\xBA\xAC\xE5\xB8\x82\", \"offset\": 0}, {\"word\": \"\xE9\x95\xBF\xE6\xB1\x9F\", \"offset\": 9}, {\"word\": \"\xE5\xA4\xA7\xE6\xA1\xA5\", \"offset\": 15}]", result << words);

  jieba.CutHMM("我来自北京邮电大学。。。学号123456", words);
  result << words;
  ASSERT_EQ("[{\"word\": \"\xE6\x88\x91\xE6\x9D\xA5\", \"offset\": 0}, {\"word\": \"\xE8\x87\xAA\xE5\x8C\x97\xE4\xBA\xAC\", \"offset\": 6}, {\"word\": \"\xE9\x82\xAE\xE7\x94\xB5\xE5\xA4\xA7\xE5\xAD\xA6\", \"offset\": 15}, {\"word\": \"\xE3\x80\x82\", \"offset\": 27}, {\"word\": \"\xE3\x80\x82\", \"offset\": 30}, {\"word\": \"\xE3\x80\x82\", \"offset\": 33}, {\"word\": \"\xE5\xAD\xA6\xE5\x8F\xB7\", \"offset\": 36}, {\"word\": \"123456\", \"offset\": 42}]", result);

  jieba.Cut("我来自北京邮电大学。。。学号123456，用AK47", words);
  result << words;
  //ASSERT_EQ("[\"我\", \"来自\", \"北京邮电大学\", \"。\", \"。\", \"。\", \"学号\", \"123456\", \"，\", \"用\", \"AK47\"]", result);
  ASSERT_EQ("[{\"word\": \"\xE6\x88\x91\", \"offset\": 0}, {\"word\": \"\xE6\x9D\xA5\xE8\x87\xAA\", \"offset\": 3}, {\"word\": \"\xE5\x8C\x97\xE4\xBA\xAC\xE9\x82\xAE\xE7\x94\xB5\xE5\xA4\xA7\xE5\xAD\xA6\", \"offset\": 9}, {\"word\": \"\xE3\x80\x82\", \"offset\": 27}, {\"word\": \"\xE3\x80\x82\", \"offset\": 30}, {\"word\": \"\xE3\x80\x82\", \"offset\": 33}, {\"word\": \"\xE5\xAD\xA6\xE5\x8F\xB7\", \"offset\": 36}, {\"word\": \"123456\", \"offset\": 42}, {\"word\": \"\xEF\xBC\x8C\", \"offset\": 48}, {\"word\": \"\xE7\x94\xA8\", \"offset\": 51}, {\"word\": \"AK47\", \"offset\": 54}]", result);

  jieba.CutAll("我来自北京邮电大学", words);
  result << words;
  //ASSERT_EQ(result, "[\"我\", \"来自\", \"北京\", \"北京邮电\", \"北京邮电大学\", \"邮电\", \"邮电大学\", \"电大\", \"大学\"]");
  ASSERT_EQ("[{\"word\": \"\xE6\x88\x91\", \"offset\": 0}, {\"word\": \"\xE6\x9D\xA5\xE8\x87\xAA\", \"offset\": 3}, {\"word\": \"\xE5\x8C\x97\xE4\xBA\xAC\", \"offset\": 9}, {\"word\": \"\xE5\x8C\x97\xE4\xBA\xAC\xE9\x82\xAE\xE7\x94\xB5\", \"offset\": 9}, {\"word\": \"\xE5\x8C\x97\xE4\xBA\xAC\xE9\x82\xAE\xE7\x94\xB5\xE5\xA4\xA7\xE5\xAD\xA6\", \"offset\": 9}, {\"word\": \"\xE9\x82\xAE\xE7\x94\xB5\", \"offset\": 15}, {\"word\": \"\xE9\x82\xAE\xE7\x94\xB5\xE5\xA4\xA7\xE5\xAD\xA6\", \"offset\": 15}, {\"word\": \"\xE7\x94\xB5\xE5\xA4\xA7\", \"offset\": 18}, {\"word\": \"\xE5\xA4\xA7\xE5\xAD\xA6\", \"offset\": 21}]", result);

  jieba.CutForSearch("他来到了网易杭研大厦", words);
  result << words;
  //ASSERT_EQ("[\"他\", \"来到\", \"了\", \"网易\", \"杭研\", \"大厦\"]", result);
  ASSERT_EQ("[{\"word\": \"\xE4\xBB\x96\", \"offset\": 0}, {\"word\": \"\xE6\x9D\xA5\xE5\x88\xB0\", \"offset\": 3}, {\"word\": \"\xE4\xBA\x86\", \"offset\": 9}, {\"word\": \"\xE7\xBD\x91\xE6\x98\x93\", \"offset\": 12}, {\"word\": \"\xE6\x9D\xAD\xE7\xA0\x94\", \"offset\": 18}, {\"word\": \"\xE5\xA4\xA7\xE5\x8E\xA6\", \"offset\": 24}]", result);
}